

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

array<Centaurus::CharClass<unsigned_char>,_3UL> * __thiscall
Centaurus::CharClass<unsigned_char>::diff_and_int
          (array<Centaurus::CharClass<unsigned_char>,_3UL> *__return_storage_ptr__,
          CharClass<unsigned_char> *this,CharClass<unsigned_char> *cc)

{
  pointer pRVar1;
  long lVar2;
  pointer pRVar3;
  pointer pRVar4;
  Range<unsigned_char> rj;
  Range<unsigned_char> ri;
  Range<unsigned_char> local_68;
  Range<unsigned_char> local_58;
  Range<unsigned_char> local_48;
  CharClass<unsigned_char> *local_38;
  
  lVar2 = 0;
  do {
    CharClass((CharClass<unsigned_char> *)
              ((long)&__return_storage_ptr__->_M_elems[0]._vptr_CharClass + lVar2));
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x60);
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48._vptr_Range = (_func_int **)&PTR__Range_001a1570;
  local_48.m_start = '\0';
  local_48.m_end = '\0';
  local_58._vptr_Range = (_func_int **)&PTR__Range_001a1570;
  local_58.m_start = '\0';
  local_58.m_end = '\0';
  if (pRVar1 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_48.m_start = pRVar1->m_start;
    local_48.m_end = pRVar1->m_end;
  }
  if (pRVar4 != (cc->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_58.m_start = pRVar4->m_start;
    local_58.m_end = pRVar4->m_end;
  }
  if ((pRVar1 != (this->m_ranges).
                 super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (pRVar4 != (cc->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)) {
    local_38 = __return_storage_ptr__->_M_elems + 2;
    pRVar3 = pRVar4;
    do {
      pRVar4 = pRVar3;
      if (local_58.m_start < local_48.m_end) {
        if (local_48.m_start < local_58.m_end) {
          if (local_48.m_start < local_58.m_start) {
            local_68._vptr_Range = (_func_int **)&PTR__Range_001a1570;
            local_68.m_start = local_48.m_start;
            local_68.m_end = local_58.m_start;
            append(__return_storage_ptr__->_M_elems,&local_68);
            local_48.m_start = local_58.m_start;
          }
          else {
            if (local_48.m_start <= local_58.m_start) {
              if (local_48.m_end <= local_58.m_end) {
                if (local_48.m_end < local_58.m_end) {
                  local_68._vptr_Range = (_func_int **)&PTR__Range_001a1570;
                  local_68.m_start = local_48.m_start;
                  local_68.m_end = local_48.m_end;
                  append(local_38,&local_68);
                  local_58.m_start = local_48.m_end;
                  goto LAB_0011dc33;
                }
                local_68._vptr_Range = (_func_int **)&PTR__Range_001a1570;
                local_68.m_start = local_48.m_start;
                local_68.m_end = local_58.m_end;
                append(local_38,&local_68);
                if (pRVar1 + 1 !=
                    (this->m_ranges).
                    super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  local_48.m_start = pRVar1[1].m_start;
                  local_48.m_end = pRVar1[1].m_end;
                }
                pRVar4 = pRVar3 + 1;
                if (pRVar4 != (cc->m_ranges).
                              super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish) {
                  local_58.m_start = pRVar3[1].m_start;
                  local_58.m_end = pRVar3[1].m_end;
                }
                goto LAB_0011dc46;
              }
              local_68._vptr_Range = (_func_int **)&PTR__Range_001a1570;
              local_68.m_start = local_58.m_start;
              local_68.m_end = local_58.m_end;
              append(local_38,&local_68);
              local_48.m_start = local_58.m_end;
              goto LAB_0011dc58;
            }
            local_68._vptr_Range = (_func_int **)&PTR__Range_001a1570;
            local_68.m_start = local_58.m_start;
            local_68.m_end = local_48.m_start;
            append(__return_storage_ptr__->_M_elems + 1,&local_68);
            local_58.m_start = local_48.m_start;
          }
        }
        else {
          append(__return_storage_ptr__->_M_elems + 1,&local_58);
LAB_0011dc58:
          pRVar4 = pRVar3 + 1;
          if (pRVar4 != (cc->m_ranges).
                        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            local_58.m_start = pRVar3[1].m_start;
            local_58.m_end = pRVar3[1].m_end;
          }
        }
      }
      else {
        append(__return_storage_ptr__->_M_elems,&local_48);
LAB_0011dc33:
        if (pRVar1 + 1 !=
            (this->m_ranges).
            super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_48.m_start = pRVar1[1].m_start;
          local_48.m_end = pRVar1[1].m_end;
        }
LAB_0011dc46:
        pRVar1 = pRVar1 + 1;
      }
    } while ((pRVar1 != (this->m_ranges).
                        super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) &&
            (pRVar3 = pRVar4,
            pRVar4 != (cc->m_ranges).
                      super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish));
  }
  if (pRVar1 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pRVar3 = pRVar1 + 1;
      append(__return_storage_ptr__->_M_elems,&local_48);
      if (pRVar3 != (this->m_ranges).
                    super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_48.m_start = pRVar1[1].m_start;
        local_48.m_end = pRVar1[1].m_end;
      }
      pRVar1 = pRVar3;
    } while (pRVar3 != (this->m_ranges).
                       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (pRVar4 != (cc->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pRVar1 = pRVar4 + 1;
      append(__return_storage_ptr__->_M_elems + 1,&local_58);
      if (pRVar1 != (cc->m_ranges).
                    super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_58.m_start = pRVar4[1].m_start;
        local_58.m_end = pRVar4[1].m_end;
      }
      pRVar4 = pRVar1;
    } while (pRVar1 != (cc->m_ranges).
                       super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<CharClass<TCHAR>, 3> diff_and_int(const CharClass<TCHAR>& cc) const
    {
        //Returns 3 character classes
        //ret[0] => *this & ~cc
        //ret[1] => ~(*this) & cc
        //ret[2] => *this & cc
        std::array<CharClass<TCHAR>, 3> ret;

        auto i = m_ranges.cbegin();
        auto j = cc.m_ranges.cbegin();
        
        Range<TCHAR> ri, rj;

        if (i != m_ranges.cend())
            ri = *i;
        if (j != cc.m_ranges.cend())
            rj = *j;

        while (i != m_ranges.cend() && j != cc.m_ranges.cend())
        {
            if (ri < rj)
            {
                ret[0].append(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else if (ri > rj)
            {
                ret[1].append(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
            else
            {
                if (ri.start() < rj.start())
                {
                    //When ri begins earlier than rj
                    ret[0].append(Range<TCHAR>(ri.start(), rj.start()));
                    ri.start(rj.start());
                }
                else if (rj.start() < ri.start())
                {
                    //When rj begins earlier than ri
                    ret[1].append(Range<TCHAR>(rj.start(), ri.start()));
                    rj.start(ri.start());
                }
                else
                {
                    //ri.start() == rj.start()
                    if (ri.end() > rj.end())
                    {
                        //When ri ends later than rj
                        ret[2].append(Range<TCHAR>(rj.start(), rj.end()));
                        ri.start(rj.end());
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                    else if (ri.end() < rj.end())
                    {
                        //When rj ends later than ri
                        ret[2].append(Range<TCHAR>(ri.start(), ri.end()));
                        rj.start(ri.end());
                        if (++i != m_ranges.cend())
                            ri = *i;
                    }
                    else
                    {
                        //When ri equals to rj
                        ret[2].append(Range<TCHAR>(ri.start(), rj.end()));
                        if (++i != m_ranges.cend())
                            ri = *i;
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                }
            }
        }

        while (i != m_ranges.cend())
        {
            ret[0].append(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        while (j != cc.m_ranges.cend())
        {
            ret[1].append(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }

        /*std::cout << ret[0] << std::endl;
        std::cout << ret[1] << std::endl;
        std::cout << ret[2] << std::endl;*/

        return ret;
    }